

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O1

btBroadphaseProxy * __thiscall
btSimpleBroadphase::createProxy
          (btSimpleBroadphase *this,btVector3 *aabbMin,btVector3 *aabbMax,int shapeType,
          void *userPtr,short collisionFilterGroup,short collisionFilterMask,btDispatcher *param_7,
          void *multiSapProxy)

{
  btVector3 *pbVar1;
  int iVar2;
  btSimpleBroadphaseProxy *pbVar3;
  undefined8 uVar4;
  
  if (this->m_numHandles < this->m_maxHandles) {
    iVar2 = this->m_firstFreeHandle;
    pbVar3 = this->m_pHandles;
    this->m_firstFreeHandle = *(int *)&pbVar3[iVar2].super_btBroadphaseProxy.field_0x3c;
    this->m_numHandles = this->m_numHandles + 1;
    if (this->m_LastHandleIndex < iVar2) {
      this->m_LastHandleIndex = iVar2;
    }
    pbVar3[iVar2].super_btBroadphaseProxy.m_clientObject = userPtr;
    pbVar3[iVar2].super_btBroadphaseProxy.m_collisionFilterGroup = collisionFilterGroup;
    pbVar3[iVar2].super_btBroadphaseProxy.m_collisionFilterMask = collisionFilterMask;
    uVar4 = *(undefined8 *)(aabbMin->m_floats + 2);
    pbVar1 = &pbVar3[iVar2].super_btBroadphaseProxy.m_aabbMin;
    *(undefined8 *)pbVar1->m_floats = *(undefined8 *)aabbMin->m_floats;
    *(undefined8 *)(pbVar1->m_floats + 2) = uVar4;
    uVar4 = *(undefined8 *)(aabbMax->m_floats + 2);
    pbVar1 = &pbVar3[iVar2].super_btBroadphaseProxy.m_aabbMax;
    *(undefined8 *)pbVar1->m_floats = *(undefined8 *)aabbMax->m_floats;
    *(undefined8 *)(pbVar1->m_floats + 2) = uVar4;
    pbVar3[iVar2].super_btBroadphaseProxy.m_multiSapParentProxy = multiSapProxy;
    return &pbVar3[iVar2].super_btBroadphaseProxy;
  }
  return (btBroadphaseProxy *)0x0;
}

Assistant:

btBroadphaseProxy*	btSimpleBroadphase::createProxy(  const btVector3& aabbMin,  const btVector3& aabbMax,int shapeType,void* userPtr ,short int collisionFilterGroup,short int collisionFilterMask, btDispatcher* /*dispatcher*/,void* multiSapProxy)
{
	if (m_numHandles >= m_maxHandles)
	{
		btAssert(0);
		return 0; //should never happen, but don't let the game crash ;-)
	}
	btAssert(aabbMin[0]<= aabbMax[0] && aabbMin[1]<= aabbMax[1] && aabbMin[2]<= aabbMax[2]);

	int newHandleIndex = allocHandle();
	btSimpleBroadphaseProxy* proxy = new (&m_pHandles[newHandleIndex])btSimpleBroadphaseProxy(aabbMin,aabbMax,shapeType,userPtr,collisionFilterGroup,collisionFilterMask,multiSapProxy);

	return proxy;
}